

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O1

void __thiscall streamer::Streamer::Streamer(Streamer *this)

{
  int iVar1;
  
  (this->scaler).ctx = (SwsContext *)0x0;
  (this->picture).frame = (AVFrame *)0x0;
  (this->picture).data = (uint8_t *)0x0;
  (this->config).profile._M_dataplus._M_p = (pointer)&(this->config).profile.field_2;
  (this->config).profile._M_string_length = 0;
  (this->config).profile.field_2._M_local_buf[0] = '\0';
  (this->config).server._M_dataplus._M_p = (pointer)&(this->config).server.field_2;
  (this->config).server._M_string_length = 0;
  (this->config).server.field_2._M_local_buf[0] = '\0';
  (this->config).src_width = 0;
  (this->config).src_height = 0;
  (this->config).dst_width = 0;
  (this->config).dst_height = 0;
  (this->config).fps = 0;
  (this->config).bitrate = 0;
  this->rtmp_server_conn = false;
  this->format_ctx = (AVFormatContext *)0x0;
  this->out_codec = (AVCodec *)0x0;
  this->out_stream = (AVStream *)0x0;
  this->out_codec_ctx = (AVCodecContext *)0x0;
  av_register_all();
  this->inv_stream_timebase = 30.0;
  iVar1 = avformat_network_init();
  this->network_init_ok = iVar1 == 0;
  return;
}

Assistant:

Streamer::Streamer()
{
    format_ctx = nullptr;
    out_codec = nullptr;
    out_stream = nullptr;
    out_codec_ctx = nullptr;
    rtmp_server_conn = false;
    av_register_all();
    inv_stream_timebase = 30.0;
    network_init_ok = !avformat_network_init();
}